

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O0

void __thiscall RigidBodyDynamics::Errors::RBDLError::~RBDLError(RBDLError *this)

{
  RBDLError *in_RDI;
  
  ~RBDLError(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLError : public std::exception
{
protected:
  std::string text;
public:
  RBDLError(std::string text);
  virtual const char* what() const noexcept;
}